

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# burstsort2.cpp
# Opt level: O2

TrieNode<unsigned_char,_std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>_> *
__thiscall
BurstSimple<unsigned_char>::operator()
          (BurstSimple<unsigned_char> *this,
          vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *bucket,size_t depth)

{
  uchar *ptr;
  uchar uVar1;
  byte bVar2;
  TrieNode<unsigned_char,_std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>_> *this_00;
  vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *pvVar3;
  ulong uVar4;
  long lVar5;
  uint j;
  long lVar6;
  uchar **__x;
  ulong uVar7;
  array<unsigned_char,_64UL> cache;
  array<unsigned_char_*,_64UL> strings;
  
  this_00 = (TrieNode<unsigned_char,_std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>_>
             *)operator_new(0x18);
  (this_00->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this_00->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this_00->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar4 = (ulong)((long)(bucket->
                        super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>).
                        _M_impl.super__Vector_impl_data._M_finish -
                 (long)(bucket->
                       super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>).
                       _M_impl.super__Vector_impl_data._M_start) >> 3;
  lVar5 = 0;
  uVar7 = 0;
  do {
    if (((uint)uVar4 & 0xffffffc0) <= uVar7) {
      while( true ) {
        if ((uVar4 & 0xffffffff) <= uVar7) {
          return this_00;
        }
        strings._M_elems[0] =
             (bucket->super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>)._M_impl
             .super__Vector_impl_data._M_start[uVar7];
        bVar2 = get_char<unsigned_char>(strings._M_elems[0],depth);
        pvVar3 = TrieNode<unsigned_char,_std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>_>
                 ::get_bucket(this_00,(uint)bVar2);
        if (pvVar3 == (vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)0x0) break;
        std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>::push_back
                  (pvVar3,strings._M_elems);
        uVar7 = uVar7 + 1;
      }
      __assert_fail("sub_bucket",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/burstsort2.cpp"
                    ,0x80,
                    "TrieNode<CharT, BucketT> *BurstSimple<unsigned char>::operator()(const BucketT &, size_t) const [CharT = unsigned char, BucketT = std::vector<unsigned char *>]"
                   );
    }
    for (lVar6 = 0; lVar6 != 0x40; lVar6 = lVar6 + 1) {
      ptr = *(uchar **)
             ((long)(bucket->super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>).
                    _M_impl.super__Vector_impl_data._M_start + lVar6 * 8 + lVar5);
      strings._M_elems[lVar6] = ptr;
      uVar1 = get_char<unsigned_char>(ptr,depth);
      cache._M_elems[lVar6] = uVar1;
    }
    __x = strings._M_elems;
    for (lVar6 = 0; lVar6 != 0x40; lVar6 = lVar6 + 1) {
      pvVar3 = TrieNode<unsigned_char,_std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>_>
               ::get_bucket(this_00,(uint)cache._M_elems[lVar6]);
      if (pvVar3 == (vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)0x0) {
        __assert_fail("sub_bucket",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/burstsort2.cpp"
                      ,0x78,
                      "TrieNode<CharT, BucketT> *BurstSimple<unsigned char>::operator()(const BucketT &, size_t) const [CharT = unsigned char, BucketT = std::vector<unsigned char *>]"
                     );
      }
      std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>::push_back(pvVar3,__x);
      __x = __x + 1;
    }
    uVar7 = uVar7 + 0x40;
    lVar5 = lVar5 + 0x200;
  } while( true );
}

Assistant:

TrieNode<CharT, BucketT>*
	operator()(const BucketT& bucket, size_t depth) const
	{
		TrieNode<CharT, BucketT>* new_node = new TrieNode<CharT, BucketT>;
		const unsigned bucket_size = bucket.size();
		// Use a small cache to reduce memory stalls. Also cache the
		// string pointers, in case the indexing operation of the
		// container is expensive.
		unsigned i=0;
		for (; i < bucket_size-bucket_size%64; i+=64) {
			std::array<CharT, 64> cache;
			std::array<unsigned char*, 64> strings;
			for (unsigned j=0; j < 64; ++j) {
				strings[j] = bucket[i+j];
				cache[j] = get_char<CharT>(strings[j], depth);
			}
			for (unsigned j=0; j < 64; ++j) {
				const CharT ch = cache[j];
				BucketT* sub_bucket = new_node->get_bucket(ch);
				assert(sub_bucket);
				sub_bucket->push_back(strings[j]);
			}
		}
		for (; i < bucket_size; ++i) {
			unsigned char* ptr = bucket[i];
			const CharT ch = get_char<CharT>(ptr, depth);
			BucketT* sub_bucket = new_node->get_bucket(ch);
			assert(sub_bucket);
			sub_bucket->push_back(ptr);
		}
		return new_node;
	}